

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::
emplaceRealloc<slang::IntervalMap<unsigned_long,std::monostate,3u>>
          (SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>> *this,pointer pos,
          IntervalMap<unsigned_long,_std::monostate,_3U> *args)

{
  pointer pIVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  undefined8 uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  unsigned_long *puVar11;
  long lVar12;
  unsigned_long *puVar13;
  ulong uVar14;
  unsigned_long *puVar15;
  pointer pIVar16;
  long lVar17;
  
  if (*(long *)(this + 8) == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar14 = *(long *)(this + 8) + 1;
  uVar4 = *(ulong *)(this + 0x10);
  if (uVar14 < uVar4 * 2) {
    uVar14 = uVar4 * 2;
  }
  if (0x1ffffffffffffff - uVar4 < uVar4) {
    uVar14 = 0x1ffffffffffffff;
  }
  lVar17 = (long)pos - *(long *)this;
  puVar11 = (unsigned_long *)operator_new(uVar14 << 6);
  pIVar1 = (pointer)((long)puVar11 + lVar17);
  uVar5._0_4_ = args->height;
  uVar5._4_4_ = args->rootSize;
  args->rootSize = 0;
  *(undefined8 *)((long)puVar11 + lVar17 + 0x38) = uVar5;
  if ((undefined4)uVar5 == 0) {
    *(undefined8 *)
     &(pIVar1->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
      field_0x30 = *(undefined8 *)
                    &(args->field_0).rootLeaf.
                     super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                     .field_0x30;
    uVar6 = (args->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            first[0].left;
    uVar7 = (args->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            first[0].right;
    uVar8 = (args->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            first[1].left;
    uVar9 = (args->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            first[1].right;
    uVar10 = (args->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[2].right;
    (pIVar1->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    left = (args->field_0).rootLeaf.
           super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
           first[2].left;
    (pIVar1->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    right = uVar10;
    (pIVar1->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    left = uVar8;
    (pIVar1->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    right = uVar9;
    (pIVar1->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    left = uVar6;
    (pIVar1->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    right = uVar7;
  }
  else {
    uVar6 = (args->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            first[0].left;
    uVar7 = (args->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            first[0].right;
    uVar8 = (args->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            first[1].left;
    uVar9 = (args->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            first[1].right;
    uVar10 = (args->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[2].right;
    (pIVar1->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    left = (args->field_0).rootLeaf.
           super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
           first[2].left;
    (pIVar1->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    right = uVar10;
    (pIVar1->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    left = uVar8;
    (pIVar1->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    right = uVar9;
    (pIVar1->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    left = uVar6;
    (pIVar1->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    right = uVar7;
    (args->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    left = 0;
    (args->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    right = 0;
    (args->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    left = 0;
    (args->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    right = 0;
    (args->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    left = 0;
    (args->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    right = 0;
    *(undefined8 *)
     ((long)&(args->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[2].right + 4) = 0;
    *(undefined8 *)
     &(args->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
      field_0x34 = 0;
  }
  pIVar16 = *(pointer *)this;
  lVar12 = *(long *)(this + 8);
  if (pIVar16 + lVar12 == pos) {
    puVar13 = puVar11;
    if (lVar12 != 0) {
      do {
        uVar2 = pIVar16->height;
        *(uint32_t *)(puVar13 + 7) = uVar2;
        uVar3 = pIVar16->rootSize;
        pIVar16->rootSize = 0;
        *(uint32_t *)((long)puVar13 + 0x3c) = uVar3;
        if (uVar2 == 0) {
          puVar13[6] = *(unsigned_long *)
                        &(pIVar16->field_0).rootLeaf.
                         super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                         .field_0x30;
          uVar6 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].left;
          uVar7 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].right;
          uVar8 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].left;
          uVar9 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].right;
          uVar10 = (pIVar16->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].right;
          puVar13[4] = (pIVar16->field_0).rootLeaf.
                       super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                       .first[2].left;
          puVar13[5] = uVar10;
          puVar13[2] = uVar8;
          puVar13[3] = uVar9;
          *puVar13 = uVar6;
          puVar13[1] = uVar7;
        }
        else {
          uVar6 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].left;
          uVar7 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].right;
          uVar8 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].left;
          uVar9 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].right;
          uVar10 = (pIVar16->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].right;
          puVar13[4] = (pIVar16->field_0).rootLeaf.
                       super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                       .first[2].left;
          puVar13[5] = uVar10;
          puVar13[2] = uVar8;
          puVar13[3] = uVar9;
          *puVar13 = uVar6;
          puVar13[1] = uVar7;
          (pIVar16->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[0].left = 0;
          (pIVar16->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[0].right = 0;
          (pIVar16->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[1].left = 0;
          (pIVar16->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[1].right = 0;
          (pIVar16->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[2].left = 0;
          (pIVar16->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[2].right = 0;
          *(undefined8 *)
           ((long)&(pIVar16->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].right + 4) = 0;
          *(undefined8 *)
           &(pIVar16->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            field_0x34 = 0;
        }
        pIVar16 = pIVar16 + 1;
        puVar13 = puVar13 + 8;
      } while (pIVar16 != pos);
    }
  }
  else {
    puVar13 = puVar11;
    if (pIVar16 != pos) {
      do {
        uVar2 = pIVar16->height;
        *(uint32_t *)(puVar13 + 7) = uVar2;
        uVar3 = pIVar16->rootSize;
        pIVar16->rootSize = 0;
        *(uint32_t *)((long)puVar13 + 0x3c) = uVar3;
        if (uVar2 == 0) {
          puVar13[6] = *(unsigned_long *)
                        &(pIVar16->field_0).rootLeaf.
                         super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                         .field_0x30;
          uVar6 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].left;
          uVar7 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].right;
          uVar8 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].left;
          uVar9 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].right;
          uVar10 = (pIVar16->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].right;
          puVar13[4] = (pIVar16->field_0).rootLeaf.
                       super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                       .first[2].left;
          puVar13[5] = uVar10;
          puVar13[2] = uVar8;
          puVar13[3] = uVar9;
          *puVar13 = uVar6;
          puVar13[1] = uVar7;
        }
        else {
          uVar6 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].left;
          uVar7 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].right;
          uVar8 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].left;
          uVar9 = (pIVar16->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].right;
          uVar10 = (pIVar16->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].right;
          puVar13[4] = (pIVar16->field_0).rootLeaf.
                       super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                       .first[2].left;
          puVar13[5] = uVar10;
          puVar13[2] = uVar8;
          puVar13[3] = uVar9;
          *puVar13 = uVar6;
          puVar13[1] = uVar7;
          (pIVar16->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[0].left = 0;
          (pIVar16->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[0].right = 0;
          (pIVar16->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[1].left = 0;
          (pIVar16->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[1].right = 0;
          (pIVar16->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[2].left = 0;
          (pIVar16->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[2].right = 0;
          *(undefined8 *)
           ((long)&(pIVar16->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].right + 4) = 0;
          *(undefined8 *)
           &(pIVar16->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            field_0x34 = 0;
        }
        pIVar16 = pIVar16 + 1;
        puVar13 = puVar13 + 8;
      } while (pIVar16 != pos);
      pIVar16 = *(pointer *)this;
      lVar12 = *(long *)(this + 8);
    }
    if (pIVar16 + lVar12 != pos) {
      puVar13 = (unsigned_long *)(lVar17 + (long)puVar11);
      do {
        puVar15 = puVar13 + 8;
        uVar6._0_4_ = pos->height;
        uVar6._4_4_ = pos->rootSize;
        pos->rootSize = 0;
        puVar13[0xf] = uVar6;
        if ((undefined4)uVar6 == 0) {
          puVar13[0xe] = *(unsigned_long *)
                          &(pos->field_0).rootLeaf.
                           super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                           .field_0x30;
          uVar6 = (pos->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].left;
          uVar7 = (pos->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].right;
          uVar8 = (pos->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].left;
          uVar9 = (pos->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].right;
          uVar10 = (pos->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].right;
          puVar13[0xc] = (pos->field_0).rootLeaf.
                         super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                         .first[2].left;
          puVar13[0xd] = uVar10;
          puVar13[10] = uVar8;
          puVar13[0xb] = uVar9;
          *puVar15 = uVar6;
          puVar13[9] = uVar7;
        }
        else {
          uVar6 = (pos->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].left;
          uVar7 = (pos->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[0].right;
          uVar8 = (pos->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].left;
          uVar9 = (pos->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                  .first[1].right;
          uVar10 = (pos->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].right;
          puVar13[0xc] = (pos->field_0).rootLeaf.
                         super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                         .first[2].left;
          puVar13[0xd] = uVar10;
          puVar13[10] = uVar8;
          puVar13[0xb] = uVar9;
          *puVar15 = uVar6;
          puVar13[9] = uVar7;
          (pos->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[0].left = 0;
          (pos->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[0].right = 0;
          (pos->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[1].left = 0;
          (pos->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[1].right = 0;
          (pos->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[2].left = 0;
          (pos->field_0).rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          first[2].right = 0;
          *(undefined8 *)
           ((long)&(pos->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].right + 4) = 0;
          *(undefined8 *)
           &(pos->field_0).rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            field_0x34 = 0;
        }
        pos = pos + 1;
        puVar13 = puVar15;
      } while (pos != pIVar16 + lVar12);
    }
  }
  if (*(SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>> **)this != this + 0x18)
  {
    operator_delete(*(SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>> **)this);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar14;
  *(unsigned_long **)this = puVar11;
  return pIVar1;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}